

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O1

void __thiscall kj::_::GlobFilter::applyState(GlobFilter *this,char c,int state)

{
  char cVar1;
  uint *puVar2;
  uint *puVar3;
  RemoveConst<unsigned_int> *pRVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  
  uVar7 = (ulong)state;
  while( true ) {
    sVar6 = (this->pattern).content.size_;
    uVar5 = sVar6 - 1;
    if (sVar6 == 0) {
      uVar5 = 0;
    }
    if (uVar5 <= uVar7) {
      return;
    }
    cVar1 = (this->pattern).content.ptr[uVar7];
    if (cVar1 != '*') break;
    if ((c != '/') && (c != '\\')) {
      puVar2 = (this->states).builder.endPtr;
      if ((this->states).builder.pos == puVar2) {
        puVar3 = (this->states).builder.ptr;
        sVar6 = (long)puVar2 - (long)puVar3 >> 1;
        if (puVar2 == puVar3) {
          sVar6 = 4;
        }
        Vector<unsigned_int>::setCapacity(&this->states,sVar6);
      }
      pRVar4 = (this->states).builder.pos;
      *pRVar4 = (RemoveConst<unsigned_int>)uVar7;
      (this->states).builder.pos = pRVar4 + 1;
    }
    uVar7 = uVar7 + 1;
  }
  if (cVar1 == '?') {
    if (c == '/') {
      return;
    }
    if (c == '\\') {
      return;
    }
  }
  else if (cVar1 != c) {
    return;
  }
  puVar2 = (this->states).builder.endPtr;
  if ((this->states).builder.pos == puVar2) {
    puVar3 = (this->states).builder.ptr;
    sVar6 = 4;
    if (puVar2 != puVar3) {
      sVar6 = (long)puVar2 - (long)puVar3 >> 1;
    }
    Vector<unsigned_int>::setCapacity(&this->states,sVar6);
  }
  pRVar4 = (this->states).builder.pos;
  *pRVar4 = (RemoveConst<unsigned_int>)uVar7 + 1;
  (this->states).builder.pos = pRVar4 + 1;
  return;
}

Assistant:

void GlobFilter::applyState(char c, int state) {
  if (state < pattern.size()) {
    switch (pattern[state]) {
      case '*':
        // At a '*', we both re-add the current state and attempt to match the *next* state.
        if (c != '/' && c != '\\') {  // '*' doesn't match '/'.
          states.add(state);
        }
        applyState(c, state + 1);
        break;

      case '?':
        // A '?' matches one character (never a '/').
        if (c != '/' && c != '\\') {
          states.add(state + 1);
        }
        break;

      default:
        // Any other character matches only itself.
        if (c == pattern[state]) {
          states.add(state + 1);
        }
        break;
    }
  }
}